

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O2

UChar * __thiscall
icu_63::ResourceDataValue::getString(ResourceDataValue *this,int32_t *length,UErrorCode *errorCode)

{
  UChar *pUVar1;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pUVar1 = res_getString_63(this->pResData,this->res,length);
    if (pUVar1 != (UChar *)0x0) {
      return pUVar1;
    }
    *errorCode = U_RESOURCE_TYPE_MISMATCH;
  }
  return (UChar *)0x0;
}

Assistant:

const UChar *ResourceDataValue::getString(int32_t &length, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    const UChar *s = res_getString(pResData, res, &length);
    if(s == NULL) {
        errorCode = U_RESOURCE_TYPE_MISMATCH;
    }
    return s;
}